

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::updateMkspecPaths(QMakeEvaluator *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QString *it_1;
  add_const_t<QList<QString>_> *__range1_1;
  QString *it;
  QStringList *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList paths;
  QString concat;
  QStringList ret;
  QStringBuilder<ProString,_const_QString_&> *in_stack_fffffffffffffca8;
  QList<QString> *in_stack_fffffffffffffcb0;
  ProKey *this_00;
  QMakeGlobals *in_stack_fffffffffffffcb8;
  QMakeGlobals *this_01;
  QLatin1String *in_stack_fffffffffffffcc0;
  QMakeGlobals *in_stack_fffffffffffffcc8;
  qsizetype in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffce8;
  undefined1 local_170 [64];
  QStringBuilder<QString_&,_const_QString_&> local_130;
  QStringBuilder<const_QString_&,_const_QString_&> local_108;
  QString *local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  QStringBuilder<const_QString_&,_const_QString_&> local_c8;
  QString *local_a0;
  const_iterator local_98;
  const_iterator local_90 [6];
  Data *local_60;
  char16_t *local_58;
  qsizetype local_50;
  qsizetype local_38;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  Data *local_18;
  char16_t *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = -0x5555555555555556;
  local_18 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_10 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x2fa90b);
  local_38 = -0x5555555555555556;
  local_30 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->do_cache);
  latin1.m_data = in_stack_fffffffffffffce8;
  latin1.m_size = in_stack_fffffffffffffce0;
  QString::QString((QString *)in_stack_fffffffffffffcc0,latin1);
  local_60 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_50 = -0x5555555555555556;
  QLatin1String::QLatin1String(in_stack_fffffffffffffcc0,&in_stack_fffffffffffffcb8->do_cache);
  latin1_00.m_data = in_stack_fffffffffffffce8;
  latin1_00.m_size = in_stack_fffffffffffffce0;
  QString::QString((QString *)in_stack_fffffffffffffcc0,latin1_00);
  QMakeGlobals::getPathListEnv(in_stack_fffffffffffffcc8,(QString *)in_stack_fffffffffffffcc0);
  QString::~QString((QString *)0x2fa9ff);
  local_90[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_90[0] = QList<QString>::begin(in_stack_fffffffffffffcb0);
  local_98.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_98 = QList<QString>::end(in_stack_fffffffffffffcb0);
  while( true ) {
    local_a0 = local_98.i;
    bVar1 = QList<QString>::const_iterator::operator!=(local_90,local_98);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(local_90);
    local_c8 = ::operator+((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8
                          );
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_const_QString_&> *)in_stack_fffffffffffffca8);
    QList<QString>::operator<<(in_stack_fffffffffffffcb0,(rvalue_ref)in_stack_fffffffffffffca8);
    QString::~QString((QString *)0x2fab1a);
    QList<QString>::const_iterator::operator++(local_90);
  }
  local_d0.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_d0 = QList<QString>::begin(in_stack_fffffffffffffcb0);
  local_d8.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_d8 = QList<QString>::end(in_stack_fffffffffffffcb0);
  while( true ) {
    local_e0 = local_d8.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_d0,local_d8);
    if (!bVar1) break;
    QList<QString>::const_iterator::operator*(&local_d0);
    local_108 = ::operator+((QString *)in_stack_fffffffffffffcb0,
                            (QString *)in_stack_fffffffffffffca8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_const_QString_&> *)in_stack_fffffffffffffca8);
    QList<QString>::operator<<(in_stack_fffffffffffffcb0,(rvalue_ref)in_stack_fffffffffffffca8);
    QString::~QString((QString *)0x2fac41);
    QList<QString>::const_iterator::operator++(&local_d0);
  }
  bVar1 = QString::isEmpty((QString *)0x2fac64);
  if (!bVar1) {
    local_130 = ::operator+((QString *)in_stack_fffffffffffffcb0,
                            (QString *)in_stack_fffffffffffffca8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_fffffffffffffca8);
    QList<QString>::operator<<(in_stack_fffffffffffffcb0,(rvalue_ref)in_stack_fffffffffffffca8);
    QString::~QString((QString *)0x2facc8);
  }
  bVar1 = QString::isEmpty((QString *)0x2facd9);
  if (!bVar1) {
    local_170._24_16_ =
         (undefined1  [16])
         ::operator+((QString *)in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_fffffffffffffca8);
    QList<QString>::operator<<(in_stack_fffffffffffffcb0,(rvalue_ref)in_stack_fffffffffffffca8);
    QString::~QString((QString *)0x2fad3d);
  }
  this_00 = *(ProKey **)(in_RDI + 0x290);
  ProKey::ProKey(this_00,(char *)in_stack_fffffffffffffca8);
  QMakeGlobals::propertyValue(in_stack_fffffffffffffcb8,this_00);
  ::operator+((ProString *)in_stack_fffffffffffffcb8,(QString *)this_00);
  this_01 = (QMakeGlobals *)local_170;
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffca8);
  QList<QString>::operator<<((QList<QString> *)this_00,(rvalue_ref)in_stack_fffffffffffffca8);
  QString::~QString((QString *)0x2faddf);
  QStringBuilder<ProString,_const_QString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_const_QString_&> *)0x2fade9);
  ProString::~ProString((ProString *)0x2fadf3);
  ProKey::~ProKey((ProKey *)0x2fadfd);
  ProKey::ProKey(this_00,(char *)in_stack_fffffffffffffca8);
  QMakeGlobals::propertyValue(this_01,this_00);
  ::operator+((ProString *)this_01,(QString *)this_00);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffca8);
  QList<QString>::operator<<((QList<QString> *)this_00,(rvalue_ref)in_stack_fffffffffffffca8);
  QString::~QString((QString *)0x2fae8f);
  QStringBuilder<ProString,_const_QString_&>::~QStringBuilder
            ((QStringBuilder<ProString,_const_QString_&> *)0x2fae99);
  ProString::~ProString((ProString *)0x2faea3);
  ProKey::~ProKey((ProKey *)0x2faead);
  QListSpecialMethods<QString>::removeDuplicates((QListSpecialMethods<QString> *)0x2faeb7);
  QList<QString>::operator=((QList<QString> *)this_00,(QList<QString> *)in_stack_fffffffffffffca8);
  QList<QString>::~QList((QList<QString> *)0x2faeda);
  QString::~QString((QString *)0x2faee4);
  QList<QString>::~QList((QList<QString> *)0x2faeee);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::updateMkspecPaths()
{
    QStringList ret;
    const QString concat = QLatin1String("/mkspecs");

    const auto paths = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &it : paths)
        ret << it + concat;

    for (const QString &it : std::as_const(m_qmakepath))
        ret << it + concat;

    if (!m_buildRoot.isEmpty())
        ret << m_buildRoot + concat;
    if (!m_sourceRoot.isEmpty())
        ret << m_sourceRoot + concat;

    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + concat;
    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + concat;

    ret.removeDuplicates();
    m_mkspecPaths = ret;
}